

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAbstractButtonListModel.cpp
# Opt level: O1

bool __thiscall
QAbstractButtonListModel::insertRows
          (QAbstractButtonListModel *this,int row,int count,QModelIndex *parent)

{
  int iVar1;
  undefined8 extraout_RAX;
  QMap<int,_QVariant> local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  if (((-1 < row && 0 < count) &&
      (iVar1 = (**(code **)(*(long *)this + 0x78))(this,parent), row <= iVar1)) &&
     ((parent->r < 0 || ((parent->c < 0 || (parent->m == (QAbstractItemModel *)0x0)))))) {
    local_38.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)0xffffffffffffffff;
    local_30 = 0;
    uStack_28 = 0;
    QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_38,row);
    local_38.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)0x0;
    if ((ulong)(uint)row <= (ulong)(this->d->buttons).d.size) {
      if (count != 0) {
        QtPrivate::QMovableArrayOps<QMap<int,_QVariant>_>::insert
                  ((QMovableArrayOps<QMap<int,_QVariant>_> *)&this->d->buttons,(ulong)(uint)row,
                   (ulong)(uint)count,&local_38);
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_38.d);
      QAbstractItemModel::endInsertRows();
      return true;
    }
    insertRows();
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_38.d);
    _Unwind_Resume(extraout_RAX);
  }
  return false;
}

Assistant:

bool QAbstractButtonListModel::insertRows(int row, int count, const QModelIndex &parent) {
    if (count < 1 || row < 0 || row > rowCount(parent) || parent.isValid()) {
        return false;
    }

    beginInsertRows(QModelIndex(), row, row + count - 1);
    d->buttons.insert(row, count, {});
    endInsertRows();

    return true;
}